

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O1

CNscPStackEntry * NscBuildDeclaration(CNscPStackEntry *pType,CNscPStackEntry *pList)

{
  uint *puVar1;
  CNwnDoubleLinkList *pCVar2;
  CNscPStackEntry *pCVar3;
  CNscContext *pCVar4;
  CNwnDoubleLinkList *pCVar5;
  CNwnDoubleLinkList *pNext;
  
  pCVar4 = g_pCtx;
  pCVar2 = (g_pCtx->m_listEntryFree).m_pPrev;
  pCVar3 = (CNscPStackEntry *)(pType->m_link).m_pNext;
  if (pCVar3 != pType) {
    pCVar5 = (pType->m_link).m_pPrev;
    (pCVar3->m_link).m_pPrev = pCVar5;
    pCVar5->m_pNext = (CNwnDoubleLinkList *)pCVar3;
    (pType->m_link).m_pNext = &pType->m_link;
    (pType->m_link).m_pPrev = &pType->m_link;
  }
  pCVar5 = &pCVar4->m_listEntryFree;
  if ((CNscPStackEntry *)&pCVar4->m_listEntryFree == pType) {
    pCVar5 = pCVar2;
  }
  pCVar2 = pCVar5->m_pNext;
  (pType->m_link).m_pNext = pCVar2;
  (pType->m_link).m_pPrev = pCVar5;
  pCVar5->m_pNext = &pType->m_link;
  pCVar2->m_pPrev = &pType->m_link;
  if ((((pList != (CNscPStackEntry *)0x0) && (pList->m_nType != NscType_Error)) &&
      (g_pCtx->m_fGlobalScope == true)) &&
     ((g_pCtx->m_fPhase2 != false || (g_pCtx->m_fNWScript == true)))) {
    if (g_nNscLastDeclSymbol == 0xffffffff) {
      __assert_fail("g_nNscLastDeclSymbol != 0xffffffff",
                    "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                    ,0x5d0,
                    "CNscPStackEntry *NscBuildDeclaration(CNscPStackEntry *, CNscPStackEntry *)");
    }
    puVar1 = (uint *)((g_pCtx->m_sSymbols).m_pauchData + g_nNscLastDeclSymbol + 0x24);
    *puVar1 = *puVar1 | 0x8000000;
    g_nNscLastDeclSymbol = 0xffffffff;
  }
  return pList;
}

Assistant:

YYSTYPE NscBuildDeclaration (YYSTYPE pType, YYSTYPE pList)
{

	//
	// Free the type
	//

    g_pCtx ->FreePStackEntry (pType);

	//
	// If we have a list, mark the last symbol as being the last
	//

    if (pList != NULL && pList ->GetType () != NscType_Error && 
		g_pCtx ->IsGlobalScope () && 
		(g_pCtx ->IsPhase2 () || g_pCtx ->IsNWScript ()))
	{
		assert (g_nNscLastDeclSymbol != 0xffffffff);
		NscSymbol *pSymbol = g_pCtx ->GetSymbol (g_nNscLastDeclSymbol);
		pSymbol ->ulFlags |= NscSymFlag_LastDecl;
		g_nNscLastDeclSymbol = 0xffffffff;
	}

	//
	// Return the list
	//

	return pList;
}